

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocumentUtil.h
# Opt level: O2

Skin * Assimp::FBX::Util::ProcessSimpleConnection<Assimp::FBX::Skin>
                 (Connection *con,bool is_object_property_conn,char *name,Element *element,
                 char **propNameOut)

{
  size_type sVar1;
  Object *pOVar2;
  Skin *pSVar3;
  undefined7 in_register_00000031;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  sVar1 = (con->prop)._M_string_length;
  if ((int)CONCAT71(in_register_00000031,is_object_property_conn) == 0) {
    if (sVar1 != 0) {
      std::__cxx11::string::string((string *)&local_70,name,&local_71);
      std::operator+(&local_50,"expected incoming ",&local_70);
      std::operator+(&local_30,&local_50," link to be an object-property connection, ignoring");
      DOMWarning(&local_30,element);
      goto LAB_00504a37;
    }
  }
  else {
    if (sVar1 == 0) {
      std::__cxx11::string::string((string *)&local_70,name,&local_71);
      std::operator+(&local_50,"expected incoming ",&local_70);
      std::operator+(&local_30,&local_50," link to be an object-object connection, ignoring");
      DOMWarning(&local_30,element);
      goto LAB_00504a37;
    }
    if (propNameOut != (char **)0x0) {
      *propNameOut = (con->prop)._M_dataplus._M_p;
    }
  }
  pOVar2 = Connection::SourceObject(con);
  if (pOVar2 != (Object *)0x0) {
    pSVar3 = (Skin *)__dynamic_cast(pOVar2,&Object::typeinfo,&Skin::typeinfo,0);
    return pSVar3;
  }
  std::__cxx11::string::string((string *)&local_70,name,&local_71);
  std::operator+(&local_50,"failed to read source object for incoming ",&local_70);
  std::operator+(&local_30,&local_50," link, ignoring");
  DOMWarning(&local_30,element);
LAB_00504a37:
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return (Skin *)0x0;
}

Assistant:

inline
const T* ProcessSimpleConnection(const Connection& con,
    bool is_object_property_conn,
    const char* name,
    const Element& element,
    const char** propNameOut = nullptr)
{
    if (is_object_property_conn && !con.PropertyName().length()) {
        DOMWarning("expected incoming " + std::string(name) +
            " link to be an object-object connection, ignoring",
            &element
            );
        return nullptr;
    }
    else if (!is_object_property_conn && con.PropertyName().length()) {
        DOMWarning("expected incoming " + std::string(name) +
            " link to be an object-property connection, ignoring",
            &element
            );
        return nullptr;
    }

    if(is_object_property_conn && propNameOut) {
        // note: this is ok, the return value of PropertyValue() is guaranteed to
        // remain valid and unchanged as long as the document exists.
        *propNameOut = con.PropertyName().c_str();
    }

    const Object* const ob = con.SourceObject();
    if(!ob) {
        DOMWarning("failed to read source object for incoming " + std::string(name) +
            " link, ignoring",
            &element);
        return nullptr;
    }

    return dynamic_cast<const T*>(ob);
}